

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cpp
# Opt level: O2

void __thiscall mjs::regexp::regexp(regexp *this,wstring_view pattern,regexp_flag flags)

{
  _Head_base<0UL,_mjs::regexp::impl_*,_false> this_00;
  wchar_t *__first;
  wstring_view pattern_local;
  basic_regex<wchar_t,_std::__cxx11::regex_traits<wchar_t>_> local_48;
  
  __first = pattern._M_str;
  pattern_local._M_len = pattern._M_len;
  pattern_local._M_str = __first;
  this_00._M_head_impl = (impl *)operator_new(0x20);
  std::__cxx11::basic_regex<wchar_t,std::__cxx11::regex_traits<wchar_t>>::
  basic_regex<wchar_t_const*>
            ((basic_regex<wchar_t,std::__cxx11::regex_traits<wchar_t>> *)&local_48,__first,
             __first + pattern._M_len,0x11 - ((flags & ignore_case) == none));
  std::__cxx11::basic_regex<wchar_t,_std::__cxx11::regex_traits<wchar_t>_>::basic_regex
            ((basic_regex<wchar_t,_std::__cxx11::regex_traits<wchar_t>_> *)this_00._M_head_impl,
             &local_48);
  (this->impl_)._M_t.
  super___uniq_ptr_impl<mjs::regexp::impl,_std::default_delete<mjs::regexp::impl>_>._M_t.
  super__Tuple_impl<0UL,_mjs::regexp::impl_*,_std::default_delete<mjs::regexp::impl>_>.
  super__Head_base<0UL,_mjs::regexp::impl_*,_false>._M_head_impl = this_00._M_head_impl;
  std::__cxx11::basic_regex<wchar_t,_std::__cxx11::regex_traits<wchar_t>_>::~basic_regex(&local_48);
  std::__cxx11::wstring::wstring<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,void>
            ((wstring *)&this->pattern_,&pattern_local,(allocator<wchar_t> *)&local_48);
  this->flags_ = flags;
  return;
}

Assistant:

regexp::regexp(std::wstring_view pattern, regexp_flag flags)
    : impl_{new impl{make_regex(pattern, flags)}}
    , pattern_{pattern}
    , flags_{flags} {
}